

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

string * CoreML::Specification::GLMClassifier_PostEvaluationTransform_Name_abi_cxx11_
                   (GLMClassifier_PostEvaluationTransform value)

{
  int iVar1;
  string *local_30;
  int idx;
  GLMClassifier_PostEvaluationTransform value_local;
  
  if (GLMClassifier_PostEvaluationTransform_Name[abi:cxx11](CoreML::Specification::GLMClassifier_PostEvaluationTransform)
      ::dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&GLMClassifier_PostEvaluationTransform_Name[abi:cxx11](CoreML::Specification::GLMClassifier_PostEvaluationTransform)
                                 ::dummy);
    if (iVar1 != 0) {
      GLMClassifier_PostEvaluationTransform_Name::dummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)GLMClassifier_PostEvaluationTransform_entries,
                      (int *)&GLMClassifier_PostEvaluationTransform_entries_by_number,2,
                      (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)GLMClassifier_PostEvaluationTransform_strings_abi_cxx11_);
      __cxa_guard_release(&GLMClassifier_PostEvaluationTransform_Name[abi:cxx11](CoreML::Specification::GLMClassifier_PostEvaluationTransform)
                           ::dummy);
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)GLMClassifier_PostEvaluationTransform_entries,
                     (int *)&GLMClassifier_PostEvaluationTransform_entries_by_number,2,value);
  if (iVar1 == -1) {
    local_30 = google::protobuf::internal::GetEmptyString_abi_cxx11_();
  }
  else {
    local_30 = google::protobuf::internal::
               ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(GLMClassifier_PostEvaluationTransform_strings_abi_cxx11_ +
                        (long)iVar1 * 0x20));
  }
  return local_30;
}

Assistant:

const std::string& GLMClassifier_PostEvaluationTransform_Name(
    GLMClassifier_PostEvaluationTransform value) {
  static const bool dummy =
      ::PROTOBUF_NAMESPACE_ID::internal::InitializeEnumStrings(
          GLMClassifier_PostEvaluationTransform_entries,
          GLMClassifier_PostEvaluationTransform_entries_by_number,
          2, GLMClassifier_PostEvaluationTransform_strings);
  (void) dummy;
  int idx = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumName(
      GLMClassifier_PostEvaluationTransform_entries,
      GLMClassifier_PostEvaluationTransform_entries_by_number,
      2, value);
  return idx == -1 ? ::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString() :
                     GLMClassifier_PostEvaluationTransform_strings[idx].get();
}